

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O3

char * blogc_render(bc_slist_t *tmpl,bc_slist_t *sources,bc_slist_t *listing_entries,
                   bc_trie_t *config,_Bool listing)

{
  void **ppvVar1;
  uint uVar2;
  int *piVar3;
  bool bVar4;
  _bc_slist_t **pp_Var5;
  bool bVar6;
  int iVar7;
  bc_string_t *str;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  bc_slist_t *l;
  char *pcVar11;
  long lVar12;
  bc_trie_t *pbVar13;
  bool bVar14;
  bc_slist_t *foreach_var;
  _bc_slist_t *p_Var15;
  bc_trie_t *local_98;
  bc_slist_t *local_90;
  bc_slist_t *local_80;
  char *local_68;
  _bc_slist_t *local_60;
  _bc_slist_t *local_58;
  
  if (tmpl == (bc_slist_t *)0x0) {
    return (char *)0x0;
  }
  bVar6 = false;
  str = bc_string_new();
  bVar4 = false;
  local_58 = (_bc_slist_t *)0x0;
  l = (bc_slist_t *)0x0;
  foreach_var = (bc_slist_t *)0x0;
  local_68 = (char *)0x0;
  local_98 = (bc_trie_t *)0x0;
  local_60 = (_bc_slist_t *)0x0;
  local_90 = (bc_slist_t *)0x0;
  local_80 = listing_entries;
  do {
    piVar3 = (int *)tmpl->data;
    switch(*piVar3) {
    case 1:
    case 3:
      bVar14 = true;
      goto LAB_00103f67;
    case 2:
      bVar14 = false;
LAB_00103f67:
      if (*(char **)(piVar3 + 2) == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        pbVar13 = (bc_trie_t *)0x0;
        if (bVar4) {
          pbVar13 = local_98;
        }
        pcVar11 = blogc_format_variable(*(char **)(piVar3 + 2),config,pbVar13,local_68,foreach_var);
      }
      if (piVar3[1] == 0) {
        if (bVar14 == (pcVar11 == (char *)0x0)) goto LAB_001041a6;
LAB_00104352:
        bVar6 = false;
      }
      else {
        pcVar9 = *(char **)(piVar3 + 4);
        if (pcVar9 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          sVar8 = strlen(pcVar9);
          if (((sVar8 < 2) || (*pcVar9 != '\"')) || (pcVar9[sVar8 - 1] != '\"')) {
            pbVar13 = (bc_trie_t *)0x0;
            if (bVar4) {
              pbVar13 = local_98;
            }
            pcVar9 = blogc_format_variable(pcVar9,config,pbVar13,local_68,foreach_var);
          }
          else {
            pcVar9 = bc_strndup(pcVar9 + 1,sVar8 - 2);
          }
          if ((pcVar11 != (char *)0x0) && (pcVar9 != (char *)0x0)) {
            iVar7 = strcmp(pcVar11,pcVar9);
            uVar2 = piVar3[1];
            if (iVar7 == 0) {
              uVar2 = uVar2 & 2;
joined_r0x00104344:
              if (uVar2 == 0) goto LAB_0010419e;
            }
            else if ((uVar2 & 1) == 0) {
              if (-1 < iVar7) {
                free(pcVar9);
                if ((uVar2 & 8) != 0) goto LAB_00104352;
                goto LAB_001041a6;
              }
              uVar2 = uVar2 & 4;
              goto joined_r0x00104344;
            }
            free(pcVar9);
            goto LAB_00104352;
          }
        }
LAB_0010419e:
        free(pcVar9);
LAB_001041a6:
        lVar10 = 0;
LAB_001041ab:
        tmpl = tmpl->next;
        iVar7 = *tmpl->data;
        if (iVar7 - 1U < 3) {
          lVar12 = 1;
          goto LAB_001041ea;
        }
        if (iVar7 != 4 || lVar10 != 0) goto code_r0x001041cf;
        bVar6 = true;
      }
LAB_0010435e:
      free(pcVar11);
      break;
    case 4:
      if (!bVar6) {
        lVar10 = 0;
LAB_001041fd:
        tmpl = tmpl->next;
        if (2 < *tmpl->data - 1U) goto code_r0x0010420f;
        lVar12 = 1;
        goto LAB_0010422a;
      }
    case 5:
switchD_00103eeb_caseD_5:
      bVar6 = false;
      break;
    case 6:
      if (l == (bc_slist_t *)0x0) {
        if (*(char **)(piVar3 + 2) != (char *)0x0) {
          pbVar13 = (bc_trie_t *)0x0;
          if (bVar4) {
            pbVar13 = local_98;
          }
          l = blogc_split_list_variable(*(char **)(piVar3 + 2),config,pbVar13);
          if (l != (bc_slist_t *)0x0) goto LAB_00104283;
        }
        iVar7 = *piVar3;
        while (iVar7 != 7) {
          tmpl = tmpl->next;
          iVar7 = *tmpl->data;
        }
        l = (bc_slist_t *)0x0;
      }
      else if (foreach_var == (bc_slist_t *)0x0) {
LAB_00104283:
        local_68 = bc_strdup(*(char **)(piVar3 + 2));
        foreach_var = l;
        local_58 = tmpl;
      }
      break;
    case 7:
      if ((local_58 == (_bc_slist_t *)0x0) || (foreach_var == (bc_slist_t *)0x0)) {
LAB_001043a5:
        bc_slist_free_full(l,free);
        free(local_68);
        local_68 = (char *)0x0;
        l = (bc_slist_t *)0x0;
        local_58 = (_bc_slist_t *)0x0;
        break;
      }
      foreach_var = foreach_var->next;
      p_Var15 = local_58;
      if (foreach_var == (bc_slist_t *)0x0) {
        foreach_var = (bc_slist_t *)0x0;
        goto LAB_001043a5;
      }
      goto LAB_00104376;
    case 8:
      pcVar11 = *(char **)(piVar3 + 2);
      iVar7 = strcmp("entry",pcVar11);
      if (iVar7 == 0) {
        if (!listing) {
          if (sources == (bc_slist_t *)0x0) {
            local_90 = (bc_slist_t *)0x0;
            local_98 = (bc_trie_t *)0x0;
          }
          else {
            local_98 = (bc_trie_t *)sources->data;
            local_90 = sources;
          }
          goto LAB_00104087;
        }
        do {
          tmpl = tmpl->next;
        } while (*tmpl->data != 9);
      }
      else {
LAB_00104087:
        iVar7 = strcmp("listing_entry",pcVar11);
        if (iVar7 == 0) {
          if (local_80 == (bc_slist_t *)0x0) {
            local_80 = (bc_slist_t *)0x0;
          }
          else {
            pp_Var5 = &local_80->next;
            ppvVar1 = &local_80->data;
            local_80 = *pp_Var5;
            if (listing && (bc_trie_t *)*ppvVar1 != (bc_trie_t *)0x0) {
              local_90 = (bc_slist_t *)0x0;
              local_98 = (bc_trie_t *)*ppvVar1;
              goto LAB_001042e5;
            }
          }
          do {
            tmpl = tmpl->next;
          } while (*tmpl->data != 9);
LAB_00104439:
          bVar4 = true;
          break;
        }
        iVar7 = strcmp("listing",pcVar11);
        if ((iVar7 == 0) || (iVar7 = strcmp("listing_empty",pcVar11), iVar7 == 0)) {
          if (listing) goto LAB_001042e5;
        }
        else {
          iVar7 = strcmp("listing_once",pcVar11);
          if (iVar7 != 0 || listing) {
LAB_001042e5:
            iVar7 = strcmp("listing_empty",pcVar11);
            if ((sources == (bc_slist_t *)0x0) || (iVar7 != 0)) {
              iVar7 = strcmp("listing",pcVar11);
              if (iVar7 == 0) {
                if (sources == (bc_slist_t *)0x0) {
                  do {
                    tmpl = tmpl->next;
                  } while (*tmpl->data != 9);
                }
                else {
                  if (local_90 == (bc_slist_t *)0x0) {
                    local_60 = tmpl;
                    local_90 = sources;
                  }
                  local_98 = (bc_trie_t *)local_90->data;
                }
              }
            }
            else {
              do {
                tmpl = tmpl->next;
              } while (*tmpl->data != 9);
            }
            goto LAB_00104439;
          }
        }
        do {
          tmpl = tmpl->next;
        } while (*tmpl->data != 9);
      }
      bVar4 = true;
      break;
    case 9:
      bVar4 = false;
      if ((local_60 != (_bc_slist_t *)0x0) && (local_90 != (bc_slist_t *)0x0)) {
        local_90 = local_90->next;
        bVar4 = false;
        p_Var15 = local_60;
        if (local_90 != (_bc_slist_t *)0x0) goto LAB_00104376;
        local_90 = (bc_slist_t *)0x0;
        local_60 = (_bc_slist_t *)0x0;
      }
      break;
    case 10:
      if (*(char **)(piVar3 + 2) != (char *)0x0) {
        pbVar13 = (bc_trie_t *)0x0;
        if (bVar4) {
          pbVar13 = local_98;
        }
        pcVar11 = blogc_format_variable(*(char **)(piVar3 + 2),config,pbVar13,local_68,foreach_var);
        if (pcVar11 != (char *)0x0) {
          bc_string_append(str,pcVar11);
          free(pcVar11);
        }
      }
      break;
    case 0xb:
      if (*(char **)(piVar3 + 2) != (char *)0x0) {
        bc_string_append(str,*(char **)(piVar3 + 2));
      }
    }
    p_Var15 = tmpl->next;
LAB_00104376:
    tmpl = p_Var15;
    if (p_Var15 == (_bc_slist_t *)0x0) {
      pcVar11 = bc_string_free(str,false);
      return pcVar11;
    }
  } while( true );
code_r0x0010420f:
  if (*tmpl->data == 5) {
    lVar12 = -1;
    if (lVar10 != 0) {
LAB_0010422a:
      lVar10 = lVar10 + lVar12;
      goto LAB_001041fd;
    }
    goto switchD_00103eeb_caseD_5;
  }
  goto LAB_001041fd;
code_r0x001041cf:
  if (iVar7 == 5) {
    lVar12 = -1;
    if (lVar10 == 0) goto LAB_0010435e;
LAB_001041ea:
    lVar10 = lVar10 + lVar12;
  }
  goto LAB_001041ab;
}

Assistant:

char*
blogc_render(bc_slist_t *tmpl, bc_slist_t *sources, bc_slist_t *listing_entries,
    bc_trie_t *config, bool listing)
{
    if (tmpl == NULL)
        return NULL;

    bc_slist_t *current_source = NULL;
    bc_slist_t *listing_start = NULL;

    bc_string_t *str = bc_string_new();

    bc_trie_t *tmp_source = NULL;
    char *config_value = NULL;
    char *defined = NULL;

    size_t if_count = 0;

    char *foreach_name = NULL;
    bc_slist_t *foreach_var = NULL;
    bc_slist_t *foreach_var_start = NULL;
    bc_slist_t *foreach_start = NULL;

    bool if_not = false;
    bool inside_block = false;
    bool evaluate = false;
    bool valid_else = false;

    int cmp = 0;

    bc_slist_t *tmp = tmpl;
    bc_slist_t *current_listing_entry = listing_entries;
    while (tmp != NULL) {
        blogc_template_node_t *node = tmp->data;

        switch (node->type) {

            case BLOGC_TEMPLATE_NODE_CONTENT:
                if (node->data[0] != NULL)
                    bc_string_append(str, node->data[0]);
                break;

            case BLOGC_TEMPLATE_NODE_BLOCK:
                inside_block = true;
                if_count = 0;
                if (0 == strcmp("entry", node->data[0])) {
                    if (listing) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                    current_source = sources;
                    tmp_source = current_source != NULL ? current_source->data : NULL;
                }
                if (0 == strcmp("listing_entry", node->data[0])) {
                    bc_trie_t *listing_entry = NULL;
                    if (current_listing_entry != NULL) {
                        listing_entry = current_listing_entry->data;
                        current_listing_entry = current_listing_entry->next;
                    }
                    if (listing_entry == NULL || !listing) {
                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                    current_source = NULL;
                    tmp_source = listing_entry;
                }
                else if ((0 == strcmp("listing", node->data[0])) ||
                         (0 == strcmp("listing_empty", node->data[0])) ||
                         (0 == strcmp("listing_once", node->data[0]))) {
                    if (!listing) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                }
                if (0 == strcmp("listing_empty", node->data[0])) {
                    if (sources != NULL) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                }
                if (0 == strcmp("listing", node->data[0])) {
                    if (sources == NULL) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                    if (current_source == NULL) {
                        listing_start = tmp;
                        current_source = sources;
                    }
                    tmp_source = current_source != NULL ? current_source->data : NULL;
                }
                break;

            case BLOGC_TEMPLATE_NODE_VARIABLE:
                if (node->data[0] != NULL) {
                    config_value = blogc_format_variable(node->data[0],
                        config, inside_block ? tmp_source : NULL, foreach_name, foreach_var);
                    if (config_value != NULL) {
                        bc_string_append(str, config_value);
                        free(config_value);
                        config_value = NULL;
                        break;
                    }
                }
                break;

            case BLOGC_TEMPLATE_NODE_ENDBLOCK:
                inside_block = false;
                if (listing_start != NULL && current_source != NULL) {
                    current_source = current_source->next;
                    if (current_source != NULL) {
                        tmp = listing_start;
                        continue;
                    }
                    else
                        listing_start = NULL;
                }
                break;

            case BLOGC_TEMPLATE_NODE_IFNDEF:
                if_not = true;

            case BLOGC_TEMPLATE_NODE_IF:
            case BLOGC_TEMPLATE_NODE_IFDEF:
                if_count = 0;
                defined = NULL;
                if (node->data[0] != NULL)
                    defined = blogc_format_variable(node->data[0], config,
                        inside_block ? tmp_source : NULL, foreach_name, foreach_var);
                evaluate = false;
                if (node->op != 0) {
                    // Strings that start with a '"' are actually strings, the
                    // others are meant to be looked up as a second variable
                    // check.
                    char *defined2 = NULL;
                    if (node->data[1] != NULL) {
                        if ((strlen(node->data[1]) >= 2) &&
                            (node->data[1][0] == '"') &&
                            (node->data[1][strlen(node->data[1]) - 1] == '"'))
                        {
                            defined2 = bc_strndup(node->data[1] + 1,
                                strlen(node->data[1]) - 2);
                        }
                        else {
                            defined2 = blogc_format_variable(node->data[1],
                                config, inside_block ? tmp_source : NULL,
                                foreach_name, foreach_var);
                        }
                    }

                    if (defined != NULL && defined2 != NULL) {
                        cmp = strcmp(defined, defined2);
                        if (cmp != 0 && node->op & BLOGC_TEMPLATE_OP_NEQ)
                            evaluate = true;
                        else if (cmp == 0 && node->op & BLOGC_TEMPLATE_OP_EQ)
                            evaluate = true;
                        else if (cmp < 0 && node->op & BLOGC_TEMPLATE_OP_LT)
                            evaluate = true;
                        else if (cmp > 0 && node->op & BLOGC_TEMPLATE_OP_GT)
                            evaluate = true;
                    }

                    free(defined2);
                }
                else {
                    if (if_not && defined == NULL)
                        evaluate = true;
                    if (!if_not && defined != NULL)
                        evaluate = true;
                }
                if (!evaluate) {

                    // at this point we can just skip anything, counting the
                    // number of 'if's, to know how many 'endif's we need to
                    // skip as well.
                    while (1) {
                        tmp = tmp->next;
                        node = tmp->data;
                        if ((node->type == BLOGC_TEMPLATE_NODE_IF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFDEF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFNDEF))
                        {
                            if_count++;
                            continue;
                        }
                        if ((node->type == BLOGC_TEMPLATE_NODE_ELSE) &&
                            (if_count == 0))
                        {
                            // this is somewhat complex. only an else statement
                            // right after a non evaluated block should be considered
                            // valid, because all the inner conditionals were just
                            // skipped, and all the outter conditionals evaluated
                            // to true.
                            valid_else = true;
                            break;
                        }
                        if (node->type == BLOGC_TEMPLATE_NODE_ENDIF) {
                            if (if_count > 0) {
                                if_count--;
                                continue;
                            }
                            break;
                        }
                    }
                }
                else {
                    valid_else = false;
                }
                free(defined);
                defined = NULL;
                if_not = false;
                break;

            case BLOGC_TEMPLATE_NODE_ELSE:
                if_count = 0;
                if (!valid_else) {

                    // at this point we can just skip anything, counting the
                    // number of 'if's, to know how many 'endif's we need to
                    // skip as well.
                    while (1) {
                        tmp = tmp->next;
                        node = tmp->data;
                        if ((node->type == BLOGC_TEMPLATE_NODE_IF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFDEF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFNDEF))
                        {
                            if_count++;
                            continue;
                        }
                        // no need to handle else statements here, because every
                        // if should have an endif.
                        if (node->type == BLOGC_TEMPLATE_NODE_ENDIF) {
                            if (if_count > 0) {
                                if_count--;
                                continue;
                            }
                            break;
                        }
                    }
                }
                valid_else = false;
                break;

            case BLOGC_TEMPLATE_NODE_ENDIF:
                // any endif statement should invalidate valid_else, to avoid
                // propagation to outter conditionals.
                valid_else = false;
                if (if_count > 0)
                    if_count--;
                break;

            case BLOGC_TEMPLATE_NODE_FOREACH:
                if (foreach_var_start == NULL) {
                    if (node->data[0] != NULL)
                        foreach_var_start = blogc_split_list_variable(node->data[0],
                            config, inside_block ? tmp_source : NULL);

                    if (foreach_var_start != NULL) {
                        foreach_name = bc_strdup(node->data[0]);
                        foreach_var = foreach_var_start;
                        foreach_start = tmp;
                    }
                    else {

                        // we can just skip anything and walk until the next
                        // 'endforeach'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDFOREACH) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                }

                if (foreach_var == NULL) {
                    foreach_start = tmp;
                    foreach_name = bc_strdup(node->data[0]);
                    foreach_var = foreach_var_start;
                }
                break;

            case BLOGC_TEMPLATE_NODE_ENDFOREACH:
                if (foreach_start != NULL && foreach_var != NULL) {
                    foreach_var = foreach_var->next;
                    if (foreach_var != NULL) {
                        tmp = foreach_start;
                        continue;
                    }
                }
                foreach_start = NULL;
                bc_slist_free_full(foreach_var_start, free);
                foreach_var_start = NULL;
                free(foreach_name);
                foreach_name = NULL;
                break;
        }
        tmp = tmp->next;
    }

    // no need to free temporary variables here. the template parser makes sure
    // that templates are sane and statements are closed.

    return bc_string_free(str, false);
}